

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O3

Float __thiscall
pbrt::ImageInfiniteLight::PDF_Li
          (ImageInfiniteLight *this,LightSampleContext ctx,Vector3f w,LightSamplingMode mode)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  Float FVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [16];
  undefined1 auVar9 [64];
  float fVar10;
  Vector3f d;
  Point2f uv;
  Tuple2<pbrt::Point2,_float> local_18;
  undefined1 extraout_var [56];
  
  auVar9._4_60_ = w._12_60_;
  auVar9._0_4_ = w.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar6._8_56_ = w._8_56_;
  auVar6._0_8_ = w.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar5 = auVar6._0_16_;
  auVar1 = vmovshdup_avx(auVar5);
  fVar10 = auVar1._0_4_;
  auVar1 = vfmadd231ss_fma(ZEXT416((uint)(fVar10 * (this->super_LightBase).renderFromLight.mInv.m[0]
                                                   [1])),auVar5,
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[0][0]));
  auVar2 = vfmadd231ss_fma(ZEXT416((uint)(fVar10 * (this->super_LightBase).renderFromLight.mInv.m[1]
                                                   [1])),auVar5,
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[1][0]));
  auVar5 = vfmadd231ss_fma(ZEXT416((uint)(fVar10 * (this->super_LightBase).renderFromLight.mInv.m[2]
                                                   [1])),auVar5,
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[2][0]));
  auVar8 = auVar9._0_16_;
  auVar1 = vfmadd231ss_fma(auVar1,auVar8,
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[0][2]));
  auVar3 = vfmadd231ss_fma(auVar2,auVar8,
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[1][2]));
  auVar2 = vfmadd132ss_fma(auVar8,auVar5,
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[2][2]));
  auVar1 = vinsertps_avx(auVar1,auVar3,0x10);
  d.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar1._0_8_;
  d.super_Tuple3<pbrt::Vector3,_float>.z = auVar2._0_4_;
  auVar7._0_8_ = EqualAreaSphereToSquare(d);
  auVar7._8_56_ = extraout_var;
  local_18 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar7._0_16_);
  FVar4 = PiecewiseConstant2D::PDF(&this->distribution + (mode == WithMIS),(Point2f *)&local_18);
  return FVar4 / 12.566371;
}

Assistant:

Float ImageInfiniteLight::PDF_Li(LightSampleContext ctx, Vector3f w,
                                 LightSamplingMode mode) const {
    Vector3f wl = renderFromLight.ApplyInverse(w);
    Point2f uv = EqualAreaSphereToSquare(wl);
    Float pdf = (mode == LightSamplingMode::WithMIS) ? compensatedDistribution.PDF(uv)
                                                     : distribution.PDF(uv);
    return pdf / (4 * Pi);
}